

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromiseresolver.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseResolver<QList<QString>>::
resolve<QtPromisePrivate::PromiseValue<QList<QString>>const&>
          (PromiseResolver<QList<QString>> *this,PromiseValue<QList<QString>_> *value)

{
  QPromise<QList<QString>_> *pQVar1;
  Data *pDVar2;
  PromiseData<QList<QString>_> *pPVar3;
  QPromise<QList<QString>_> *promise;
  PromiseValue<QList<QString>_> *value_local;
  PromiseResolver<QList<QString>_> *this_local;
  
  pDVar2 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>::
           operator->((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<QList<QString>_>::Data>
                       *)this);
  pQVar1 = pDVar2->promise;
  if (pQVar1 != (QPromise<QList<QString>_> *)0x0) {
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<QString>_>_>::
             operator->(&(pQVar1->super_QPromiseBase<QList<QString>_>).m_d);
    PromiseData<QList<QString>>::resolve<QtPromisePrivate::PromiseValue<QList<QString>>const&>
              ((PromiseData<QList<QString>> *)pPVar3,value);
    pPVar3 = QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<QList<QString>_>_>::
             operator->(&(pQVar1->super_QPromiseBase<QList<QString>_>).m_d);
    PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>::dispatch
              (&pPVar3->super_PromiseDataBase<QList<QString>,_void_(const_QList<QString>_&)>);
    PromiseResolver<QList<QString>_>::release((PromiseResolver<QList<QString>_> *)this);
  }
  return;
}

Assistant:

void resolve(V&& value)
    {
        auto promise = m_d->promise;
        if (promise) {
            Q_ASSERT(promise->isPending());
            promise->m_d->resolve(std::forward<V>(value));
            promise->m_d->dispatch();
            release();
        }
    }